

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XDisassembler.c
# Opt level: O0

void indexed12_hdlr(MCInst *MI,m680x_info *info,uint16_t *address)

{
  byte bVar1;
  uint16_t uVar2;
  uint16_t *in_RDX;
  m680x_info *in_RSI;
  uint8_t offset8;
  uint8_t post_byte;
  cs_m680x_op *op;
  cs_m680x *m680x;
  byte local_2a;
  byte local_29;
  cs_m680x_op *local_28;
  cs_m680x *local_20;
  uint16_t *local_18;
  m680x_info *local_10;
  
  local_20 = &in_RSI->m680x;
  bVar1 = (in_RSI->m680x).op_count;
  (in_RSI->m680x).op_count = bVar1 + 1;
  local_28 = (in_RSI->m680x).operands + bVar1;
  local_29 = 0;
  local_2a = 0;
  uVar2 = *in_RDX;
  *in_RDX = uVar2 + 1;
  local_18 = in_RDX;
  local_10 = in_RSI;
  read_byte(in_RSI,&local_29,uVar2);
  local_28->type = M680X_OP_INDEXED;
  set_operand_size(local_10,local_28,'\x01');
  (local_28->field_1).idx.offset_reg = M680X_REG_INVALID;
  if ((local_29 & 0x20) == 0) {
    (local_28->field_1).imm = g_idx12_to_reg_ids[(int)(uint)local_29 >> 6];
    if ((local_29 & 0x10) == 0x10) {
      (local_28->field_1).idx.offset = local_29 | 0xfff0;
    }
    else {
      (local_28->field_1).idx.offset = local_29 & 0xf;
    }
    (local_28->field_1).idx.offset_addr = (local_28->field_1).idx.offset + *local_18;
    (local_28->field_1).idx.offset_bits = '\x05';
  }
  else {
    if ((local_29 & 0xe0) == 0xe0) {
      (local_28->field_1).imm = g_idx12_to_reg_ids[(int)((int)(uint)local_29 >> 3 & 3)];
    }
    switch(local_29 & 0xe7) {
    case 0xe0:
    case 0xe1:
      uVar2 = *local_18;
      *local_18 = uVar2 + 1;
      read_byte(local_10,&local_2a,uVar2);
      *(ushort *)((long)&local_28->field_1 + 8) = (ushort)local_2a;
      if ((local_29 & 1) != 0) {
        (local_28->field_1).idx.offset = (local_28->field_1).idx.offset | 0xff00;
      }
      (local_28->field_1).idx.offset_bits = '\t';
      if ((local_28->field_1).imm == 0x13) {
        (local_28->field_1).idx.offset_addr = (local_28->field_1).idx.offset + *local_18;
      }
      break;
    case 0xe3:
      (local_28->field_1).idx.flags = (local_28->field_1).idx.flags | 1;
    case 0xe2:
      read_word(local_10,(uint16_t *)&(local_28->field_1).idx.offset,*local_18);
      *local_18 = *local_18 + 2;
      (local_28->field_1).idx.offset_bits = '\x10';
      if ((local_28->field_1).imm == 0x13) {
        (local_28->field_1).idx.offset_addr = (local_28->field_1).idx.offset + *local_18;
      }
      break;
    case 0xe4:
    case 0xe5:
    case 0xe6:
      (local_28->field_1).idx.offset_reg = g_or12_to_reg_ids[(int)(local_29 & 3)];
      break;
    case 0xe7:
      (local_28->field_1).idx.offset_reg = M680X_REG_D;
      (local_28->field_1).idx.flags = (local_28->field_1).idx.flags | 1;
      break;
    default:
      (local_28->field_1).imm = g_idx12_to_reg_ids[(int)(uint)local_29 >> 6];
      (local_28->field_1).idx.inc_dec = local_29 & 0xf;
      if (((local_28->field_1).idx.inc_dec & 8U) != 0) {
        (local_28->field_1).idx.inc_dec = (local_28->field_1).idx.inc_dec | 0xf0;
      }
      if (-1 < (local_28->field_1).idx.inc_dec) {
        (local_28->field_1).idx.inc_dec = (local_28->field_1).idx.inc_dec + '\x01';
      }
      if ((local_29 & 0x10) != 0) {
        (local_28->field_1).idx.flags = (local_28->field_1).idx.flags | 4;
      }
    }
  }
  return;
}

Assistant:

static void indexed12_hdlr(MCInst *MI, m680x_info *info, uint16_t *address)
{
	cs_m680x *m680x = &info->m680x;
	cs_m680x_op *op = &m680x->operands[m680x->op_count++];
	uint8_t post_byte = 0;
	uint8_t offset8 = 0;

	read_byte(info, &post_byte, (*address)++);

	op->type = M680X_OP_INDEXED;
	set_operand_size(info, op, 1);
	op->idx.offset_reg = M680X_REG_INVALID;

	if (!(post_byte & 0x20)) {
		// n5,R      n5 is a 5-bit signed offset
		op->idx.base_reg = g_idx12_to_reg_ids[(post_byte >> 6) & 0x03];

		if ((post_byte & 0x10) == 0x10)
			op->idx.offset = post_byte | 0xfff0;
		else
			op->idx.offset = post_byte & 0x0f;

		op->idx.offset_addr = op->idx.offset + *address;
		op->idx.offset_bits = M680X_OFFSET_BITS_5;
	}
	else {
		if ((post_byte & 0xe0) == 0xe0)
			op->idx.base_reg =
				g_idx12_to_reg_ids[(post_byte >> 3) & 0x03];

		switch (post_byte & 0xe7) {
		case 0xe0:
		case 0xe1: // n9,R
			read_byte(info, &offset8, (*address)++);
			op->idx.offset = offset8;

			if (post_byte & 0x01) // sign extension
				op->idx.offset |= 0xff00;

			op->idx.offset_bits = M680X_OFFSET_BITS_9;

			if (op->idx.base_reg == M680X_REG_PC)
				op->idx.offset_addr = op->idx.offset + *address;

			break;

		case 0xe3: // [n16,R]
			op->idx.flags |= M680X_IDX_INDIRECT;

		// intentionally fall through
		case 0xe2: // n16,R
			read_word(info, (uint16_t *)&op->idx.offset, *address);
			(*address) += 2;
			op->idx.offset_bits = M680X_OFFSET_BITS_16;

			if (op->idx.base_reg == M680X_REG_PC)
				op->idx.offset_addr = op->idx.offset + *address;

			break;

		case 0xe4: // A,R
		case 0xe5: // B,R
		case 0xe6: // D,R
			op->idx.offset_reg =
				g_or12_to_reg_ids[post_byte & 0x03];
			break;

		case 0xe7: // [D,R]
			op->idx.offset_reg = M680X_REG_D;
			op->idx.flags |= M680X_IDX_INDIRECT;
			break;

		default: // n,-r n,+r n,r- n,r+
			// PC is not allowed in this mode
			op->idx.base_reg =
				g_idx12_to_reg_ids[(post_byte >> 6) & 0x03];
			op->idx.inc_dec = post_byte & 0x0f;

			if (op->idx.inc_dec & 0x08) // evtl. sign extend value
				op->idx.inc_dec |= 0xf0;

			if (op->idx.inc_dec >= 0)
				op->idx.inc_dec++;

			if (post_byte & 0x10)
				op->idx.flags |= M680X_IDX_POST_INC_DEC;

			break;

		}
	}
}